

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_get_server_ID_Test::TestBody
          (WelcomeMessageTest_test_get_server_ID_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ss_.ptr_._0_4_ = bidfx_public_api::price::pixie::WelcomeMessage::GetServerID();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            (local_18,"SERVER_ID","WELCOME_MESSAGE.GetServerID()",&SERVER_ID,(uint *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_get_server_ID)
{
    ASSERT_EQ(SERVER_ID, WELCOME_MESSAGE.GetServerID());
}